

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToolsTest.cc
# Opt level: O2

int main(int param_1,char **param_2)

{
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> progress_fn;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> progress_fn_00;
  ulong block_size;
  uint uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  reference pvVar4;
  void *pvVar5;
  unsigned_long uVar6;
  long lVar7;
  size_type sVar8;
  size_t x;
  ulong uVar9;
  long lVar10;
  bool called;
  undefined7 uStack_2ef;
  pointer local_2e8;
  _Manager_type p_Stack_2e0;
  uint64_t target_value2;
  CallOnDestroy g1;
  uint64_t target_value3;
  ulong local_290;
  _Any_data local_288;
  code *local_278;
  code *pcStack_270;
  _Any_data local_268;
  undefined8 local_258;
  undefined8 uStack_250;
  _Any_data local_248;
  undefined8 local_238;
  undefined8 uStack_230;
  _Any_data local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  _Any_data local_208;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  _Any_data local_148;
  undefined8 local_138;
  undefined8 uStack_130;
  _Any_data local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  _Any_data local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  _Any_data local_e8;
  code *local_d8;
  code *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  _Any_data local_88;
  code *local_78;
  code *local_70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  puts("-- on_close_scope");
  local_188._M_unused._M_object = &called;
  called = false;
  local_188._8_8_ = 0;
  local_170 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:14:32)>
              ::_M_invoke;
  local_178 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:14:32)>
              ::_M_manager;
  phosg::on_close_scope(&g1,(function<void_()> *)&local_188);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  phosg::expect_generic
            ((bool)(called ^ 1),"!(!called)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x11);
  phosg::CallOnDestroy::~CallOnDestroy(&g1);
  phosg::expect_generic
            (called,"!(called)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x13);
  uVar1 = std::thread::hardware_concurrency();
  puts("-- parallel_range");
  called = false;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&g1,0x1000000,&called,
             (allocator_type *)&target_value2);
  uVar2 = phosg::now();
  uVar9 = (ulong)uVar1;
  local_1a8._8_8_ = 0;
  local_190 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:27:25)>
              ::_M_invoke;
  local_198 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:27:25)>
              ::_M_manager;
  local_208._M_unused._M_object = (void *)0x0;
  local_208._8_8_ = 0;
  local_1f8 = 0;
  uStack_1f0 = 0;
  local_1a8._M_unused._M_object = &g1;
  phosg::parallel_range<unsigned_long>
            ((function<bool_(unsigned_long,_unsigned_long)> *)&local_1a8,0,
             g1.f.super__Function_base._M_functor._8_8_ - g1.f.super__Function_base._M_functor._0_8_
             ,uVar9,(function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                    &local_208);
  std::_Function_base::~_Function_base((_Function_base *)&local_208);
  std::_Function_base::~_Function_base((_Function_base *)&local_1a8);
  uVar3 = phosg::now();
  fprintf(_stderr,"---- time: %lu\n",uVar3 - uVar2);
  target_value2 = 0;
  local_290 = uVar9;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&called,uVar9,&target_value2,
             (allocator_type *)&target_value3);
  for (uVar9 = 0;
      uVar9 < (ulong)(g1.f.super__Function_base._M_functor._8_8_ -
                     g1.f.super__Function_base._M_functor._0_8_); uVar9 = uVar9 + 1) {
    phosg::expect_generic
              (*(char *)((long)g1.f.super__Function_base._M_functor._M_unused._0_8_ + uVar9) != '\0'
               ,"hits[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x26);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&called,
                        (ulong)*(byte *)((long)g1.f.super__Function_base._M_functor._M_unused._0_8_
                                        + uVar9) - 1);
    *pvVar4 = *pvVar4 + 1;
  }
  lVar7 = CONCAT71(uStack_2ef,called);
  lVar10 = 0;
  for (uVar9 = 0; uVar9 < (ulong)((long)local_2e8 - lVar7 >> 3); uVar9 = uVar9 + 1) {
    phosg::expect_generic
              (*(long *)(lVar7 + uVar9 * 8) != 0,"thread_counts[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x2c);
    fprintf(_stderr,"---- thread %zu: %zu\n",uVar9,
            *(undefined8 *)(CONCAT71(uStack_2ef,called) + uVar9 * 8));
    lVar7 = CONCAT71(uStack_2ef,called);
    lVar10 = lVar10 + *(long *)(lVar7 + uVar9 * 8);
  }
  phosg::expect_generic
            (lVar10 == g1.f.super__Function_base._M_functor._8_8_ -
                       g1.f.super__Function_base._M_functor._0_8_,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x30);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&called);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&g1);
  puts("-- parallel_range return value");
  uVar9 = local_290;
  g1.f.super__Function_base._M_functor._M_unused._M_object = (void *)0xc349;
  local_88._8_8_ = 0;
  local_70 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:54:21)>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:54:21)>
             ::_M_manager;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f8 = 0;
  uStack_f0 = 0;
  local_88._M_unused._M_object = &g1;
  pvVar5 = (void *)phosg::parallel_range<unsigned_long>
                             ((function<bool_(unsigned_long,_unsigned_long)> *)&local_88,0,0x10000,
                              local_290,
                              (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                               *)&local_108);
  phosg::expect_generic
            (pvVar5 == g1.f.super__Function_base._M_functor._M_unused._M_object,
             "(parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)) != target_value"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x39);
  std::_Function_base::~_Function_base((_Function_base *)&local_108);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  local_a8._8_8_ = 0;
  g1.f.super__Function_base._M_functor._M_unused._M_object = &DAT_000cc349;
  local_90 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:54:21)>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:54:21)>
             ::_M_manager;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_a8._M_unused._M_object = &g1;
  uVar6 = phosg::parallel_range<unsigned_long>
                    ((function<bool_(unsigned_long,_unsigned_long)> *)&local_a8,0,0x10000,uVar9,
                     (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
                     &local_128);
  phosg::expect_generic
            (uVar6 == 0x10000,
             "(parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)) != 0x10000",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x40);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  puts("-- parallel_range_blocks");
  called = false;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&g1,0x1000000,&called,
             (allocator_type *)&target_value2);
  uVar2 = phosg::now();
  local_1c8._8_8_ = 0;
  local_1b0 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:70:25)>
              ::_M_invoke;
  local_1b8 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:70:25)>
              ::_M_manager;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_1c8._M_unused._M_object = &g1;
  phosg::parallel_range_blocks<unsigned_long>
            ((function<bool_(unsigned_long,_unsigned_long)> *)&local_1c8,0,
             g1.f.super__Function_base._M_functor._8_8_ - g1.f.super__Function_base._M_functor._0_8_
             ,0x1000,uVar9,
             (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *)
             &local_228);
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  std::_Function_base::~_Function_base((_Function_base *)&local_1c8);
  uVar3 = phosg::now();
  fprintf(_stderr,"---- time: %lu\n",uVar3 - uVar2);
  target_value2 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&called,uVar9,&target_value2,
             (allocator_type *)&target_value3);
  for (uVar9 = 0;
      uVar9 < (ulong)(g1.f.super__Function_base._M_functor._8_8_ -
                     g1.f.super__Function_base._M_functor._0_8_); uVar9 = uVar9 + 1) {
    phosg::expect_generic
              (*(char *)((long)g1.f.super__Function_base._M_functor._M_unused._0_8_ + uVar9) != '\0'
               ,"hits[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x51);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&called,
                        (ulong)*(byte *)((long)g1.f.super__Function_base._M_functor._M_unused._0_8_
                                        + uVar9) - 1);
    *pvVar4 = *pvVar4 + 1;
  }
  lVar7 = CONCAT71(uStack_2ef,called);
  lVar10 = 0;
  for (uVar9 = 0; uVar9 < (ulong)((long)local_2e8 - lVar7 >> 3); uVar9 = uVar9 + 1) {
    phosg::expect_generic
              (*(long *)(lVar7 + uVar9 * 8) != 0,"thread_counts[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x57);
    fprintf(_stderr,"---- thread %zu: %zu\n",uVar9,
            *(undefined8 *)(CONCAT71(uStack_2ef,called) + uVar9 * 8));
    lVar7 = CONCAT71(uStack_2ef,called);
    lVar10 = lVar10 + *(long *)(lVar7 + uVar9 * 8);
  }
  phosg::expect_generic
            (lVar10 == g1.f.super__Function_base._M_functor._8_8_ -
                       g1.f.super__Function_base._M_functor._0_8_,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x5b);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&called);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&g1);
  puts("-- parallel_range_blocks return value");
  uVar9 = local_290;
  g1.f.super__Function_base._M_functor._M_unused._M_object = (void *)0xc349;
  local_c8._8_8_ = 0;
  local_b0 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:97:21)>
             ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:97:21)>
             ::_M_manager;
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_c8._M_unused._M_object = &g1;
  pvVar5 = (void *)phosg::parallel_range_blocks<unsigned_long>
                             ((function<bool_(unsigned_long,_unsigned_long)> *)&local_c8,0,0x100000,
                              0x1000,local_290,
                              (function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                               *)&local_148);
  phosg::expect_generic
            (pvVar5 == g1.f.super__Function_base._M_functor._M_unused._M_object,
             "(parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)) != target_value"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,100);
  std::_Function_base::~_Function_base((_Function_base *)&local_148);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  local_e8._8_8_ = 0;
  g1.f.super__Function_base._M_functor._M_unused._M_object = &DAT_00ccc349;
  local_d0 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:97:21)>
             ::_M_invoke;
  local_d8 = std::
             _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:97:21)>
             ::_M_manager;
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_e8._M_unused._M_object = &g1;
  uVar6 = phosg::parallel_range_blocks<unsigned_long>
                    ((function<bool_(unsigned_long,_unsigned_long)> *)&local_e8,0,0x100000,0x1000,
                     uVar9,(function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
                            *)&local_168);
  phosg::expect_generic
            (uVar6 == 0x100000,
             "(parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)) != 0x100000"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x6b);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_e8);
  puts("-- parallel_range_blocks_multi");
  called = false;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&g1,0x1000000,&called,
             (allocator_type *)&target_value2);
  uVar2 = phosg::now();
  local_1e8._8_8_ = 0;
  local_1d0 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:113:25)>
              ::_M_invoke;
  local_1d8 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:113:25)>
              ::_M_manager;
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_238 = 0;
  uStack_230 = 0;
  progress_fn.super__Function_base._M_functor._1_7_ = uStack_2ef;
  progress_fn.super__Function_base._M_functor._M_pod_data[0] = called;
  progress_fn.super__Function_base._M_functor._8_8_ = local_2e8;
  progress_fn.super__Function_base._M_manager = p_Stack_2e0;
  progress_fn._M_invoker = (_Invoker_type)target_value2;
  local_1e8._M_unused._M_object = &g1;
  phosg::
  parallel_range_blocks_multi<unsigned_long,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)&local_68,(phosg *)local_1e8._M_pod_data,
             (function<bool_(unsigned_long,_unsigned_long)> *)0x0,
             g1.f.super__Function_base._M_functor._8_8_ - g1.f.super__Function_base._M_functor._0_8_
             ,0x1000,uVar9,(size_t)&local_248,progress_fn);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_248);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
  uVar3 = phosg::now();
  fprintf(_stderr,"---- time: %lu\n",uVar3 - uVar2);
  target_value2 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&called,uVar9,&target_value2,
             (allocator_type *)&target_value3);
  for (uVar9 = 0; block_size = local_290,
      uVar9 < (ulong)(g1.f.super__Function_base._M_functor._8_8_ -
                     g1.f.super__Function_base._M_functor._0_8_); uVar9 = uVar9 + 1) {
    phosg::expect_generic
              (*(char *)((long)g1.f.super__Function_base._M_functor._M_unused._0_8_ + uVar9) != '\0'
               ,"hits[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x7c);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&called,
                        (ulong)*(byte *)((long)g1.f.super__Function_base._M_functor._M_unused._0_8_
                                        + uVar9) - 1);
    *pvVar4 = *pvVar4 + 1;
  }
  lVar7 = CONCAT71(uStack_2ef,called);
  lVar10 = 0;
  for (uVar9 = 0; uVar9 < (ulong)((long)local_2e8 - lVar7 >> 3); uVar9 = uVar9 + 1) {
    phosg::expect_generic
              (*(long *)(lVar7 + uVar9 * 8) != 0,"thread_counts[x] == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
               ,0x82);
    fprintf(_stderr,"---- thread %zu: %zu\n",uVar9,
            *(undefined8 *)(CONCAT71(uStack_2ef,called) + uVar9 * 8));
    lVar7 = CONCAT71(uStack_2ef,called);
    lVar10 = lVar10 + *(long *)(lVar7 + uVar9 * 8);
  }
  phosg::expect_generic
            (lVar10 == g1.f.super__Function_base._M_functor._8_8_ -
                       g1.f.super__Function_base._M_functor._0_8_,"sum != hits.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x86);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&called);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&g1);
  puts("-- parallel_range_blocks_multi return value");
  called = true;
  uStack_2ef = 0xc3;
  target_value2 = 0x53a0;
  target_value3 = 0x34d;
  local_288._M_unused._M_object = (void *)0x0;
  local_288._8_8_ = 0;
  local_278 = (code *)0x0;
  pcStack_270 = (code *)0x0;
  local_288._M_unused._M_object = operator_new(0x18);
  *(_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> **)local_288._M_unused._0_8_ =
       (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&called;
  *(uint64_t **)((long)local_288._M_unused._0_8_ + 8) = &target_value2;
  *(uint64_t **)((long)local_288._M_unused._0_8_ + 0x10) = &target_value3;
  pcStack_270 = std::
                _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:142:21)>
                ::_M_invoke;
  local_278 = std::
              _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc:142:21)>
              ::_M_manager;
  local_268._M_unused._M_object = (void *)0x0;
  local_268._8_8_ = 0;
  local_258 = 0;
  uStack_250 = 0;
  progress_fn_00.super__Function_base._M_functor._1_7_ = uStack_2ef;
  progress_fn_00.super__Function_base._M_functor._M_pod_data[0] = called;
  progress_fn_00.super__Function_base._M_functor._8_8_ = local_2e8;
  progress_fn_00.super__Function_base._M_manager = p_Stack_2e0;
  progress_fn_00._M_invoker = (_Invoker_type)target_value2;
  phosg::
  parallel_range_blocks_multi<unsigned_long,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
            ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)&g1,(phosg *)local_288._M_pod_data,
             (function<bool_(unsigned_long,_unsigned_long)> *)0x0,0x100000,0x1000,block_size,
             (size_t)&local_268,progress_fn_00);
  std::_Function_base::~_Function_base((_Function_base *)&local_268);
  std::_Function_base::~_Function_base((_Function_base *)&local_288);
  phosg::expect_generic
            (g1.f._M_invoker == (_Invoker_type)0x3,"3 != found.size()",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x92);
  sVar8 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&g1,(key_type *)&called);
  phosg::expect_generic
            (sVar8 != 0,"!(found.count(target_value1))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x93);
  sVar8 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&g1,&target_value2);
  phosg::expect_generic
            (sVar8 != 0,"!(found.count(target_value2))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x94);
  sVar8 = std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&g1,&target_value3);
  phosg::expect_generic
            (sVar8 != 0,"!(found.count(target_value3))",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/ToolsTest.cc"
             ,0x95);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&g1);
  puts("ToolsTest: all tests passed");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    printf("-- on_close_scope\n");
    bool called = false;
    {
      auto g1 = on_close_scope([&]() {
        called = true;
      });
      expect(!called);
    }
    expect(called);
  }

  const size_t num_threads = thread::hardware_concurrency();

  {
    printf("-- parallel_range\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range<uint64_t>(handle_value, 0, hits.size(), num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range return value\n");
    uint64_t target_value = 0xC349;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return (v == target_value);
    };
    expect_eq((parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)), target_value);
    // Note: We can't check that parallel_range ends early when fn returns true
    // because it's not actually guaranteed to do so - it's only guaranteed to
    // return any of the values for which fn returns true. One could imagine a sequence of events in
    // which the target value's call takes a very long time, and all other threads
    // could finish checking all other values before the target one returns true.
    target_value = 0xCC349; // > end_value; should not be found
    expect_eq((parallel_range<uint64_t>(is_equal, 0, 0x10000, num_threads, nullptr)), 0x10000);
  }

  {
    printf("-- parallel_range_blocks\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range_blocks<uint64_t>(handle_value, 0, hits.size(), 0x1000, num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range_blocks return value\n");
    uint64_t target_value = 0xC349;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return (v == target_value);
    };
    expect_eq((parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)), target_value);
    // Note: We can't check that parallel_range ends early when fn returns true
    // because it's not actually guaranteed to do so - it's only guaranteed to
    // return any of the values for which fn returns true. One could imagine a sequence of events in
    // which the target value's call takes a very long time, and all other threads
    // could finish checking all other values before the target one returns true.
    target_value = 0xCCC349; // > end_value; should not be found
    expect_eq((parallel_range_blocks<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr)), 0x100000);
  }

  {
    printf("-- parallel_range_blocks_multi\n");
    vector<uint8_t> hits(0x1000000, 0);
    auto handle_value = [&](uint64_t v, size_t thread_num) -> bool {
      hits[v] = thread_num + 1;
      return false;
    };
    uint64_t start_time = now();
    parallel_range_blocks_multi<uint64_t>(handle_value, 0, hits.size(), 0x1000, num_threads, nullptr);
    uint64_t duration = now() - start_time;
    fprintf(stderr, "---- time: %" PRIu64 "\n", duration);

    vector<size_t> thread_counts(num_threads, 0);
    for (size_t x = 0; x < hits.size(); x++) {
      expect_ne(hits[x], 0);
      thread_counts.at(hits[x] - 1)++;
    }

    size_t sum = 0;
    for (size_t x = 0; x < thread_counts.size(); x++) {
      expect_ne(thread_counts[x], 0);
      fprintf(stderr, "---- thread %zu: %zu\n", x, thread_counts[x]);
      sum += thread_counts[x];
    }
    expect_eq(sum, hits.size());
  }

  {
    printf("-- parallel_range_blocks_multi return value\n");
    uint64_t target_value1 = 0xC349;
    uint64_t target_value2 = 0x53A0;
    uint64_t target_value3 = 0x034D;
    auto is_equal = [&](uint64_t v, size_t) -> bool {
      return ((v == target_value1) || (v == target_value2) || (v == target_value3));
    };
    auto found = parallel_range_blocks_multi<uint64_t>(is_equal, 0, 0x100000, 0x1000, num_threads, nullptr);
    expect_eq(3, found.size());
    expect(found.count(target_value1));
    expect(found.count(target_value2));
    expect(found.count(target_value3));
  }

  printf("ToolsTest: all tests passed\n");
  return 0;
}